

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

void Saig_BmcLoadCnf(Saig_Bmc_t *p,Cnf_Dat_t *pCnf)

{
  Aig_Man_t *p_00;
  void *pvVar1;
  Cnf_Dat_t *pCVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pObj;
  int iVar7;
  long lVar8;
  int Lits [2];
  uint local_40;
  int local_3c;
  Cnf_Dat_t *local_38;
  
  local_38 = pCnf;
  for (iVar7 = 0; pCVar2 = local_38, iVar7 < p->vVisited->nSize; iVar7 = iVar7 + 1) {
    p_00 = p->pFrm;
    iVar4 = Vec_IntEntry(p->vVisited,iVar7);
    pObj = Aig_ManObj(p_00,iVar4);
    pvVar1 = (pObj->field_5).pData;
    (pObj->field_5).pData = (void *)0x0;
    iVar4 = pCVar2->pVarNums[*(int *)((long)pvVar1 + 0x24)];
    if (iVar4 != -1) {
      iVar5 = Saig_BmcSatNum(p,pObj);
      if (iVar5 == 0) {
        Saig_BmcSetSatNum(p,pObj,iVar4);
      }
      else {
        local_3c = iVar4 * 2 + 1;
        local_40 = iVar5 * 2;
        iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
        if (iVar6 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                        ,0x243,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
        }
        local_3c = iVar4 * 2;
        local_40 = iVar5 * 2 | 1;
        iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                        ,0x247,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
        }
      }
    }
  }
  lVar3 = 0;
  do {
    lVar8 = lVar3;
    iVar7 = pCVar2->nClauses;
    if (iVar7 <= lVar8) goto LAB_0042eac1;
    iVar7 = sat_solver_addclause(p->pSat,pCVar2->pClauses[lVar8],pCVar2->pClauses[lVar8 + 1]);
    lVar3 = lVar8 + 1;
  } while (iVar7 != 0);
  iVar7 = pCVar2->nClauses;
LAB_0042eac1:
  if ((int)lVar8 < iVar7) {
    puts("SAT solver became UNSAT after adding clauses.");
  }
  return;
}

Assistant:

void Saig_BmcLoadCnf( Saig_Bmc_t * p, Cnf_Dat_t * pCnf )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i, Lits[2], VarNumOld, VarNumNew;
    Aig_ManForEachObjVec( p->vVisited, p->pFrm, pObj, i )
    {
        // get the new variable of this node
        pObjNew     = (Aig_Obj_t *)pObj->pData;
        pObj->pData = NULL;
        VarNumNew   = pCnf->pVarNums[ pObjNew->Id ];
        if ( VarNumNew == -1 )
            continue;
        // get the old variable of this node
        VarNumOld   = Saig_BmcSatNum( p, pObj );
        if ( VarNumOld == 0 )
        {
            Saig_BmcSetSatNum( p, pObj, VarNumNew );
            continue;
        }
        // add clauses connecting existing variables
        Lits[0] = toLitCond( VarNumOld, 0 );
        Lits[1] = toLitCond( VarNumNew, 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( VarNumOld, 1 );
        Lits[1] = toLitCond( VarNumNew, 0 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // add CNF to the SAT solver
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( p->pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            break;
    if ( i < pCnf->nClauses )
        printf( "SAT solver became UNSAT after adding clauses.\n" );
}